

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void Js::JavascriptArray::ArraySpliceHelper<void*>
               (JavascriptArray *pnewArr,JavascriptArray *pArr,uint32 start,uint32 deleteLen,
               Var *insertArgs,uint32 insertLen,ScriptContext *scriptContext)

{
  Type *addr;
  Type *pTVar1;
  uint uVar2;
  Recycler *recycler;
  Type TVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  undefined4 *puVar7;
  SparseArraySegment<void_*> *pSVar8;
  SparseArraySegmentBase *pSVar9;
  SparseArraySegmentBase *pSVar10;
  Type TVar11;
  uint uVar12;
  Type TVar13;
  uint32 uVar14;
  uint uVar15;
  Type *addr_00;
  Type *pTVar16;
  Type *local_58;
  Type *local_50;
  Type *local_38;
  
  recycler = scriptContext->recycler;
  addr = &pArr->head;
  TVar11.ptr = (pArr->head).ptr;
  if (TVar11.ptr == (SparseArraySegmentBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1c5f,"(pArr->head)","pArr->head");
    if (!bVar5) goto LAB_00b94d1e;
    *puVar7 = 0;
    TVar11.ptr = addr->ptr;
  }
  if (TVar11.ptr == EmptySegment) {
    AllocateHead<void*>(pArr);
    TVar11.ptr = (pArr->head).ptr;
  }
  uVar12 = (TVar11.ptr)->left + (TVar11.ptr)->size;
  if (CARRY4((TVar11.ptr)->left,(TVar11.ptr)->size)) {
    uVar12 = 0xffffffff;
  }
  local_58 = (Type *)addr;
  if (start < uVar12) {
    pSVar9 = (SparseArraySegmentBase *)0x0;
    local_50 = (Type *)addr;
  }
  else {
    do {
      pSVar9 = TVar11.ptr;
      local_50 = local_58;
      local_58 = (Type *)&pSVar9->next;
      TVar11.ptr = (pSVar9->next).ptr;
      if (TVar11.ptr == (SparseArraySegmentBase *)0x0) {
        IsInlineSegment((SparseArraySegmentBase *)0x0,pArr);
        goto LAB_00b94765;
      }
      uVar12 = (TVar11.ptr)->left + (TVar11.ptr)->size;
      if (CARRY4((TVar11.ptr)->left,(TVar11.ptr)->size)) {
        uVar12 = 0xffffffff;
      }
    } while (uVar12 <= start);
  }
  uVar15 = deleteLen + start;
  bVar5 = IsInlineSegment(TVar11.ptr,pArr);
  uVar12 = (TVar11.ptr)->left;
  if ((uVar12 <= start) && (uVar15 <= (TVar11.ptr)->length + uVar12)) {
    pSVar9 = ((TVar11.ptr)->next).ptr;
    ArraySegmentSpliceHelper<void*>
              (pnewArr,(SparseArraySegment<void_*> *)TVar11.ptr,local_58,start,deleteLen,insertArgs,
               insertLen,recycler);
    if (pSVar9 != (SparseArraySegmentBase *)0x0) {
      do {
        pSVar9->left = pSVar9->left + (insertLen - deleteLen);
        pSVar10 = (pSVar9->next).ptr;
        if (pSVar10 == (SparseArraySegmentBase *)0x0) {
          SparseArraySegmentBase::EnsureSizeInBound(pSVar9);
          pSVar10 = (pSVar9->next).ptr;
        }
        pSVar9 = pSVar10;
      } while (pSVar10 != (SparseArraySegmentBase *)0x0);
    }
    if (*(SparseArraySegmentBase **)local_58 == (SparseArraySegmentBase *)0x0) {
      return;
    }
    SparseArraySegmentBase::EnsureSizeInBound(*(SparseArraySegmentBase **)local_58);
    return;
  }
  addr_00 = &pnewArr->head;
  if (uVar12 < start) {
    uVar12 = uVar12 + (TVar11.ptr)->length;
    uVar14 = uVar12 - start;
    if (start <= uVar12 && uVar14 != 0) {
      pSVar8 = SparseArraySegment<void_*>::AllocateSegmentImpl<false>
                         (recycler,0,uVar14,uVar14,(SparseArraySegmentBase *)0x0);
      pSVar9 = &SparseArraySegment<void_*>::CopySegment(recycler,pSVar8,0,TVar11.ptr,start,uVar14)->
                super_SparseArraySegmentBase;
      (pSVar9->next).ptr = (SparseArraySegmentBase *)0x0;
      Memory::Recycler::WBSetBit((char *)addr_00);
      addr_00->ptr = pSVar9;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
      SparseArraySegment<void_*>::Truncate((SparseArraySegment<void_*> *)TVar11.ptr,start);
      addr_00 = &pSVar9->next;
    }
    pSVar9 = TVar11.ptr;
    pTVar16 = (Type *)&(TVar11.ptr)->next;
    local_50 = local_58;
  }
  else {
    if (!bVar5) goto LAB_00b946ea;
    if (start < uVar12) goto LAB_00b946ea;
    uVar2 = (TVar11.ptr)->length + uVar12;
    uVar14 = uVar2 - start;
    pTVar16 = local_58;
    if (uVar2 < start || uVar14 == 0) {
      if (uVar12 != 0 || (TVar11.ptr)->length != 0) goto LAB_00b946ea;
      if ((TVar11.ptr)->size == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x1cda,"(startSeg->size != 0)","startSeg->size != 0");
        if (!bVar5) goto LAB_00b94d1e;
        *puVar7 = 0;
      }
      pSVar10 = ((TVar11.ptr)->next).ptr;
      Memory::Recycler::WBSetBit((char *)local_58);
      *(SparseArraySegmentBase **)local_58 = pSVar10;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(local_58);
    }
    else {
      pSVar8 = SparseArraySegment<void_*>::AllocateSegmentImpl<false>
                         (recycler,0,uVar14,uVar14,(SparseArraySegmentBase *)0x0);
      pSVar10 = &SparseArraySegment<void_*>::CopySegment(recycler,pSVar8,0,TVar11.ptr,start,uVar14)
                 ->super_SparseArraySegmentBase;
      Memory::Recycler::WBSetBit((char *)addr_00);
      addr_00->ptr = pSVar10;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
      addr_00 = &pSVar10->next;
      pSVar10 = ((TVar11.ptr)->next).ptr;
      Memory::Recycler::WBSetBit((char *)local_58);
      *(SparseArraySegmentBase **)local_58 = pSVar10;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(local_58);
      (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
        .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])(pArr,TVar11.ptr,0);
    }
  }
  TVar11.ptr = ((TVar11.ptr)->next).ptr;
  local_58 = pTVar16;
  while (TVar11.ptr != (SparseArraySegmentBase *)0x0) {
LAB_00b946ea:
    TVar13 = (TVar11.ptr)->left;
    if (uVar15 < (TVar11.ptr)->length + TVar13) {
      bVar5 = false;
      local_38 = local_50;
      if (pSVar9 != (SparseArraySegmentBase *)0x0) goto LAB_00b948c7;
      local_38 = local_58;
      if (TVar13 != 0) goto LAB_00b947b9;
      TVar13 = 0;
      pSVar9 = (SparseArraySegmentBase *)0x0;
      local_38 = local_50;
      goto LAB_00b948c7;
    }
    pTVar1 = &(TVar11.ptr)->next;
    TVar3.ptr = ((TVar11.ptr)->next).ptr;
    (TVar11.ptr)->left = TVar13 - start;
    ((TVar11.ptr)->next).ptr = (SparseArraySegmentBase *)0x0;
    Memory::Recycler::WBSetBit((char *)addr_00);
    addr_00->ptr = TVar11.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
    Memory::Recycler::WBSetBit((char *)local_58);
    *(SparseArraySegmentBase **)local_58 = TVar3.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(local_58);
    TVar11.ptr = TVar3.ptr;
    addr_00 = pTVar1;
  }
  if (pSVar9 == (SparseArraySegmentBase *)0x0) {
    bVar5 = true;
    TVar11.ptr = (SparseArraySegmentBase *)0x0;
    local_38 = local_58;
LAB_00b947b9:
    if (addr->ptr != TVar11.ptr) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1cf6,"(pArr->head == startSeg)","pArr->head == startSeg");
      if (!bVar6) goto LAB_00b94d1e;
      *puVar7 = 0;
    }
    EnsureHeadStartsFromZero<void*>(pArr,recycler);
    pSVar9 = (pArr->head).ptr;
    if ((pSVar9 == (SparseArraySegmentBase *)0x0) || ((pSVar9->next).ptr != TVar11.ptr)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1cf8,"(pArr->head && pArr->head->next == startSeg)",
                                  "pArr->head && pArr->head->next == startSeg");
      if (!bVar6) goto LAB_00b94d1e;
      *puVar7 = 0;
      pSVar9 = addr->ptr;
    }
    local_58 = (Type *)&pSVar9->next;
    if (bVar5) {
      if (TVar11.ptr != (SparseArraySegmentBase *)0x0) goto LAB_00b94a09;
    }
    else {
      TVar13 = (TVar11.ptr)->left;
      bVar5 = true;
LAB_00b948c7:
      uVar12 = uVar15 - TVar13;
      if (TVar13 <= uVar15 && uVar12 != 0) {
        pSVar8 = SparseArraySegment<void_*>::AllocateSegmentImpl<false>
                           (recycler,TVar13 - start,uVar12,(SparseArraySegmentBase *)0x0);
        pSVar10 = &SparseArraySegment<void_*>::CopySegment
                             (recycler,pSVar8,(TVar11.ptr)->left - start,TVar11.ptr,
                              (TVar11.ptr)->left,uVar12)->super_SparseArraySegmentBase;
        (pSVar10->next).ptr = (SparseArraySegmentBase *)0x0;
        Memory::Recycler::WBSetBit((char *)addr_00);
        addr_00->ptr = pSVar10;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
        Memory::
        MoveArray<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
                  ((WriteBarrierPtr<void> *)(TVar11.ptr + 1),
                   (WriteBarrierPtr<void> *)(&TVar11.ptr[1].left + (ulong)uVar12 * 2),
                   (ulong)((TVar11.ptr)->length - uVar12));
        (TVar11.ptr)->left = (TVar11.ptr)->left + uVar12;
        (TVar11.ptr)->length = (TVar11.ptr)->length - uVar12;
        SparseArraySegmentBase::CheckLengthvsSize(TVar11.ptr);
        SparseArraySegment<void_*>::Truncate
                  ((SparseArraySegment<void_*> *)TVar11.ptr,
                   (TVar11.ptr)->length + (TVar11.ptr)->left);
        SparseArraySegmentBase::EnsureSizeInBound(TVar11.ptr);
        TVar13 = (TVar11.ptr)->left;
      }
      if (bVar5 && (TVar13 - deleteLen) + insertLen == 0) {
        if (TVar13 - deleteLen != start) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x1d17,"(start + insertLen == 0)","start + insertLen == 0");
          if (!bVar5) goto LAB_00b94d1e;
          *puVar7 = 0;
        }
        Memory::Recycler::WBSetBit((char *)addr);
        addr->ptr = TVar11.ptr;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        pSVar9 = (SparseArraySegmentBase *)0x0;
        local_58 = (Type *)addr;
      }
LAB_00b94a09:
      do {
        (TVar11.ptr)->left = (TVar11.ptr)->left + (insertLen - deleteLen);
        pSVar10 = ((TVar11.ptr)->next).ptr;
        if (pSVar10 == (SparseArraySegmentBase *)0x0) {
          SparseArraySegmentBase::EnsureSizeInBound(TVar11.ptr);
          pSVar10 = ((TVar11.ptr)->next).ptr;
        }
        TVar11.ptr = pSVar10;
      } while (pSVar10 != (SparseArraySegmentBase *)0x0);
    }
    SparseArraySegmentBase::EnsureSizeInBound((pnewArr->head).ptr);
    if (pSVar9 != (SparseArraySegmentBase *)0x0) goto LAB_00b94a54;
    bVar5 = true;
    pSVar9 = (SparseArraySegmentBase *)0x0;
  }
  else {
LAB_00b94765:
    SparseArraySegmentBase::EnsureSizeInBound((pnewArr->head).ptr);
    local_38 = local_50;
LAB_00b94a54:
    SparseArraySegmentBase::EnsureSizeInBound(pSVar9);
    bVar5 = false;
  }
  if (insertLen == 0) {
    return;
  }
  bVar6 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>(pArr);
  if ((bVar6) || (bVar6 = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(pArr), bVar6)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1d34,
                                "(!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr))"
                                ,
                                "!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr)"
                               );
    if (!bVar6) goto LAB_00b94d1e;
    *puVar7 = 0;
  }
  if (!bVar5) {
    uVar12 = pSVar9->left;
    if (start < uVar12) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1d3a,"(!savePrev || savePrev->left <= start)",
                                  "!savePrev || savePrev->left <= start");
      if (!bVar5) {
LAB_00b94d1e:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar7 = 0;
      uVar12 = pSVar9->left;
    }
    uVar15 = pSVar9->size - (start - uVar12);
    if (start - uVar12 <= pSVar9->size && uVar15 != 0) {
      uVar14 = insertLen - uVar15;
      TVar11.ptr = pSVar9;
      if (uVar15 <= insertLen && uVar14 != 0) {
        bVar5 = IsInlineSegment(pSVar9,pArr);
        pSVar10 = (pSVar9->next).ptr;
        if (pSVar10 == (SparseArraySegmentBase *)0x0) {
          TVar11.ptr = &SparseArraySegment<void_*>::GrowByMin(pSVar9,recycler,uVar14)->
                        super_SparseArraySegmentBase;
        }
        else {
          TVar11.ptr = &SparseArraySegment<void_*>::GrowByMinMax
                                  (pSVar9,recycler,uVar14,
                                   pSVar10->left - (pSVar9->left + pSVar9->size))->
                        super_SparseArraySegmentBase;
        }
        if (bVar5) {
          (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
                    (pArr,pSVar9,0);
        }
      }
      Memory::Recycler::WBSetBit((char *)local_38);
      *(SparseArraySegmentBase **)local_38 = TVar11.ptr;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(local_38);
      (TVar11.ptr)->length = (insertLen + start) - (TVar11.ptr)->left;
      SparseArraySegmentBase::CheckLengthvsSize(TVar11.ptr);
      goto LAB_00b94c78;
    }
  }
  TVar11.ptr = &SparseArraySegment<void_*>::AllocateSegmentImpl<false>
                          (recycler,start,insertLen,*(SparseArraySegmentBase **)local_58)->
                super_SparseArraySegmentBase;
  TVar3.ptr = *(SparseArraySegmentBase **)local_58;
  Memory::Recycler::WBSetBit((char *)&(TVar11.ptr)->next);
  ((TVar11.ptr)->next).ptr = TVar3.ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&(TVar11.ptr)->next);
  Memory::Recycler::WBSetBit((char *)local_58);
  *(SparseArraySegmentBase **)local_58 = TVar11.ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(local_58);
LAB_00b94c78:
  Memory::CopyArray<void*,Memory::WriteBarrierPtr<void>,Memory::Recycler>
            ((void **)(&TVar11.ptr[1].left + (ulong)(start - (TVar11.ptr)->left) * 2),
             (ulong)insertLen,insertArgs,(ulong)insertLen);
  return;
}

Assistant:

void JavascriptArray::ArraySpliceHelper(JavascriptArray* pnewArr, JavascriptArray* pArr, uint32 start, uint32 deleteLen, Var* insertArgs, uint32 insertLen, ScriptContext *scriptContext)
    {
        // Skip pnewArr->EnsureHead(): we don't use existing segment at all.
        Recycler *recycler  = scriptContext->GetRecycler();

        Field(SparseArraySegmentBase*)* prevSeg  = &pArr->head;        // holds the next pointer of previous
        Field(SparseArraySegmentBase*)* prevPrevSeg  = &pArr->head;    // this holds the previous pointer to prevSeg dirty trick.
        SparseArraySegmentBase* savePrev = nullptr;

        Assert(pArr->head); // We should never have a null head.
        pArr->EnsureHead<T>();
        SparseArraySegment<T>* startSeg = SparseArraySegment<T>::From(pArr->head);

        const uint32 limit = start + deleteLen;
        uint32 rightLimit;
        if (UInt32Math::Add(startSeg->left, startSeg->size, &rightLimit))
        {
            rightLimit = JavascriptArray::MaxArrayLength;
        }

        // Find out the segment to start delete
        while (startSeg && (rightLimit <= start))
        {
            savePrev = startSeg;
            prevPrevSeg = prevSeg;
            prevSeg = &startSeg->next;
            startSeg = SparseArraySegment<T>::From(startSeg->next);

            if (startSeg)
            {
                if (UInt32Math::Add(startSeg->left, startSeg->size, &rightLimit))
                {
                    rightLimit = JavascriptArray::MaxArrayLength;
                }
            }
        }

        bool hasInlineSegment = JavascriptArray::IsInlineSegment(startSeg, pArr);
        if (startSeg)
        {
            // Delete Phase
            if (startSeg->left <= start && (startSeg->left + startSeg->length) >= limit)
            {
                // All splice happens in one segment.
                SparseArraySegmentBase *nextSeg = startSeg->next;
                // Splice the segment first, which might OOM throw but the array would be intact.
                JavascriptArray::ArraySegmentSpliceHelper(
                    pnewArr, startSeg, SparseArraySegment<T>::AddressFrom(prevSeg),
                    start, deleteLen, insertArgs, insertLen, recycler);
                while (nextSeg)
                {
                    // adjust next segments left
                    nextSeg->left = nextSeg->left - deleteLen + insertLen;
                    if (nextSeg->next == nullptr)
                    {
                        nextSeg->EnsureSizeInBound();
                    }
                    nextSeg = nextSeg->next;
                }
                if (*prevSeg)
                {
                    (*prevSeg)->EnsureSizeInBound();
                }
                return;
            }
            else
            {
                SparseArraySegment<T>* newHeadSeg = nullptr; // pnewArr->head is null
                Field(SparseArraySegmentBase*)* prevNewHeadSeg = &pnewArr->head;

                // delete till deleteLen and reuse segments for new array if it is possible.
                // 3 steps -
                //1. delete 1st segment (which may be partial delete)
                // 2. delete next n complete segments
                // 3. delete last segment (which again may be partial delete)

                // Step (1)  -- WOOB 1116297: When left >= start, step (1) is skipped, resulting in pNewArr->head->left != 0. We need to touch up pNewArr.
                if (startSeg->left < start)
                {
                    if (start < startSeg->left + startSeg->length)
                    {
                        uint32 headDeleteLen = startSeg->left + startSeg->length - start;

                        if (startSeg->next)
                        {
                            // We know the new segment will have a next segment, so allocate it as non-leaf.
                            newHeadSeg = SparseArraySegment<T>::template AllocateSegmentImpl<false>(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        else
                        {
                            newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, 0, startSeg, start, headDeleteLen);
                        newHeadSeg->next = nullptr;
                        *prevNewHeadSeg = newHeadSeg;
                        prevNewHeadSeg = &newHeadSeg->next;
                        startSeg->Truncate(start);
                    }
                    savePrev = startSeg;
                    prevPrevSeg = prevSeg;
                    prevSeg = &startSeg->next;
                    startSeg = SparseArraySegment<T>::From(startSeg->next);
                }

                // Step (2) first we should do a hard copy if we have an inline head Segment
                else if (hasInlineSegment && nullptr != startSeg)
                {
                    // start should be in between left and left + length
                    if (startSeg->left  <= start && start < startSeg->left + startSeg->length)
                    {
                        uint32 headDeleteLen = startSeg->left + startSeg->length - start;
                        if (startSeg->next)
                        {
                            // We know the new segment will have a next segment, so allocate it as non-leaf.
                            newHeadSeg = SparseArraySegment<T>::template AllocateSegmentImpl<false>(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        else
                        {
                            newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, 0, startSeg, start, headDeleteLen);
                        *prevNewHeadSeg = newHeadSeg;
                        prevNewHeadSeg = &newHeadSeg->next;

                        // Remove the entire segment from the original array
                        *prevSeg = startSeg->next;
                        pArr->ClearElements(startSeg, 0);
                        startSeg = SparseArraySegment<T>::From(startSeg->next);
                    }
                    // if we have an inline head segment with 0 elements, remove it
                    else if (startSeg->left == 0 && startSeg->length == 0)
                    {
                        Assert(startSeg->size != 0);
                        *prevSeg = startSeg->next;
                        startSeg = SparseArraySegment<T>::From(startSeg->next);
                    }
                }
                // Step (2) proper
                SparseArraySegmentBase *temp = nullptr;
                while (startSeg && (startSeg->left + startSeg->length) <= limit)
                {
                    temp = startSeg->next;

                    // move that entire segment to new array
                    startSeg->left = startSeg->left - start;
                    startSeg->next = nullptr;
                    *prevNewHeadSeg = startSeg;
                    prevNewHeadSeg = &startSeg->next;

                    // Remove the entire segment from the original array
                    *prevSeg = temp;
                    startSeg = (SparseArraySegment<T>*)temp;
                }

                // Step(2) above could delete the original head segment entirely, causing current head not
                // starting from 0. Then if any of the following throw, we have a corrupted array. Need
                // protection here.
                bool dummyHeadNodeInserted = false;
                if (!savePrev && (!startSeg || startSeg->left != 0))
                {
                    Assert(pArr->head == startSeg);
                    pArr->EnsureHeadStartsFromZero<T>(recycler);
                    Assert(pArr->head && pArr->head->next == startSeg);

                    savePrev = pArr->head;
                    prevPrevSeg = prevSeg;
                    prevSeg = &pArr->head->next;
                    dummyHeadNodeInserted = true;
                }

                // Step (3)
                if (startSeg && (startSeg->left < limit))
                {
                    // copy the first part of the last segment to be deleted to new array
                    uint32 headDeleteLen = start + deleteLen - startSeg->left ;

                    newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, startSeg->left -  start, headDeleteLen, (SparseArraySegmentBase *)nullptr);
                    newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, startSeg->left -  start, startSeg, startSeg->left, headDeleteLen);
                    newHeadSeg->next = nullptr;
                    *prevNewHeadSeg = newHeadSeg;
                    prevNewHeadSeg = &newHeadSeg->next;

                    // move the last segment
                    MoveArray(startSeg->elements, startSeg->elements + headDeleteLen, startSeg->length - headDeleteLen);
                    startSeg->left = startSeg->left + headDeleteLen; // We are moving the left ahead to point to the right index
                    startSeg->length = startSeg->length - headDeleteLen;
                    startSeg->CheckLengthvsSize();
                    startSeg->Truncate(startSeg->left + startSeg->length);
                    startSeg->EnsureSizeInBound(); // Just truncated, size might exceed next.left
                }

                if (startSeg && ((startSeg->left - deleteLen + insertLen) == 0) && dummyHeadNodeInserted)
                {
                    Assert(start + insertLen == 0);
                    // Remove the dummy head node to preserve array consistency.
                    pArr->head = startSeg;
                    savePrev = nullptr;
                    prevSeg = &pArr->head;
                }

                while (startSeg)
                {
                    startSeg->left = startSeg->left - deleteLen + insertLen ;
                    if (startSeg->next == nullptr)
                    {
                        startSeg->EnsureSizeInBound();
                    }
                    startSeg = SparseArraySegment<T>::From(startSeg->next);
                }
            }
        }

        // The size of pnewArr head allocated in above step 1 might exceed next.left concatenated in step 2/3.
        pnewArr->head->EnsureSizeInBound();
        if (savePrev)
        {
            savePrev->EnsureSizeInBound();
        }

        // insert elements
        if (insertLen > 0)
        {
            Assert(!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr));

            // InsertPhase
            SparseArraySegment<T> *segInsert = nullptr;

            // see if we are just about the right of the previous segment
            Assert(!savePrev || savePrev->left <= start);
            if (savePrev && (start - savePrev->left < savePrev->size))
            {
                segInsert = (SparseArraySegment<T>*)savePrev;
                uint32 spaceLeft = segInsert->size - (start - segInsert->left);
                if(spaceLeft < insertLen)
                {
                    SparseArraySegment<T> *oldSegInsert = segInsert;
                    bool isInlineSegment = JavascriptArray::IsInlineSegment(segInsert, pArr);
                    if (!segInsert->next)
                    {
                        segInsert = segInsert->GrowByMin(recycler, insertLen - spaceLeft);
                    }
                    else
                    {
                        segInsert = segInsert->GrowByMinMax(recycler, insertLen - spaceLeft, segInsert->next->left - segInsert->left - segInsert->size);
                    }

                    if (isInlineSegment)
                    {
                        pArr->ClearElements(oldSegInsert, 0);
                    }
                }
                *prevPrevSeg = segInsert;
                segInsert->length = start + insertLen - segInsert->left;
                segInsert->CheckLengthvsSize();
            }
            else
            {
                segInsert = SparseArraySegment<T>::AllocateSegment(recycler, start, insertLen, *prevSeg);
                segInsert->next = *prevSeg;
                *prevSeg = segInsert;
                savePrev = segInsert;
            }

            uint32 relativeStart = start - segInsert->left;
            // inserted elements starts at argument 3 of splice(start, deleteNumber, insertelem1, insertelem2, insertelem3, ...);
            CopyArray(segInsert->elements + relativeStart, insertLen,
                      reinterpret_cast<const T*>(insertArgs), insertLen);
        }
    }